

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

xmlParserInputPtr xmlNewInputFromString(char *url,char *str,int flags)

{
  xmlParserInputBufferPtr buf_00;
  xmlParserInputBufferPtr buf;
  int flags_local;
  char *str_local;
  char *url_local;
  
  if (str == (char *)0x0) {
    url_local = (char *)0x0;
  }
  else {
    buf_00 = xmlNewInputBufferString(str,flags);
    if (buf_00 == (xmlParserInputBufferPtr)0x0) {
      url_local = (char *)0x0;
    }
    else {
      url_local = (char *)xmlNewInputInternal(buf_00,url);
    }
  }
  return (xmlParserInputPtr)url_local;
}

Assistant:

xmlParserInputPtr
xmlNewInputFromString(const char *url, const char *str, int flags) {
    xmlParserInputBufferPtr buf;

    if (str == NULL)
	return(NULL);

    buf = xmlNewInputBufferString(str, flags);
    if (buf == NULL)
        return(NULL);

    return(xmlNewInputInternal(buf, url));
}